

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O2

void __thiscall
FunctionTable::InsertTerm
          (FunctionTable *this,string *func_name,int space_length,int return_value_number,
          vector<_SymbolType,_std::allocator<_SymbolType>_> *argument_type)

{
  pointer p_Var1;
  pointer p_Var2;
  FunctionTableTerm term;
  string sStack_d8;
  FunctionTableTerm local_b8;
  
  p_Var1 = (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  p_Var2 = (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&sStack_d8,(string *)func_name);
  FunctionTableTerm::FunctionTableTerm
            (&local_b8,&sStack_d8,space_length,(int)((ulong)((long)p_Var1 - (long)p_Var2) >> 2),
             return_value_number,argument_type);
  std::__cxx11::string::~string((string *)&sStack_d8);
  std::vector<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>::push_back
            (&this->m_func_table,&local_b8);
  this->m_current_term_ptr = this->m_current_term_ptr + 1;
  FunctionTableTerm::~FunctionTableTerm(&local_b8);
  return;
}

Assistant:

void FunctionTable::InsertTerm(const string& func_name,
                               int space_length,
                               int return_value_number,
                               const vector<SymbolType>& argument_type) {
    int argument_number = argument_type.size();
    FunctionTableTerm term(func_name, space_length, argument_number, return_value_number, argument_type);
    m_func_table.push_back(term);
    m_current_term_ptr++;
}